

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

bool __thiscall
chrono::ChLinkMarkers::ReferenceMarkers(ChLinkMarkers *this,ChMarker *mark1,ChMarker *mark2)

{
  int iVar1;
  int iVar2;
  
  (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x48])();
  iVar2 = 0;
  iVar1 = 0;
  if (mark1 != (ChMarker *)0x0) {
    iVar1 = (mark1->super_ChObj).m_identifier;
  }
  this->markID1 = iVar1;
  if (mark2 != (ChMarker *)0x0) {
    iVar2 = (mark2->super_ChObj).m_identifier;
  }
  this->markID2 = iVar2;
  return mark1 != (ChMarker *)0x0 && mark2 != (ChMarker *)0x0;
}

Assistant:

bool ChLinkMarkers::ReferenceMarkers(ChMarker* mark1, ChMarker* mark2) {
    this->SetUpMarkers(mark1, mark2);

    if (mark1)
        SetMarkID1(mark1->GetIdentifier());
    else
        SetMarkID1(0);
    if (mark2)
        SetMarkID2(mark2->GetIdentifier());
    else
        SetMarkID2(0);

    return mark1 && mark2;
}